

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_compilestring(HSQUIRRELVM v)

{
  SQInteger size_00;
  SQRESULT SVar1;
  SQInteger size;
  SQChar *name;
  SQChar *src;
  SQInteger nargs;
  HSQUIRRELVM v_local;
  
  nargs = (SQInteger)v;
  src = (SQChar *)sq_gettop(v);
  name = (SQChar *)0x0;
  size = (SQInteger)anon_var_dwarf_51ae;
  sq_getstring((HSQUIRRELVM)nargs,2,&name);
  size_00 = sq_getsize((HSQUIRRELVM)nargs,2);
  if (2 < (long)src) {
    sq_getstring((HSQUIRRELVM)nargs,3,(SQChar **)&size);
  }
  SVar1 = sq_compilebuffer((HSQUIRRELVM)nargs,name,size_00,(SQChar *)size,0);
  if (SVar1 < 0) {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    v_local = (HSQUIRRELVM)0x1;
  }
  return (SQInteger)v_local;
}

Assistant:

static SQInteger base_compilestring(HSQUIRRELVM v)
{
    SQInteger nargs=sq_gettop(v);
    const SQChar *src=NULL,*name=_SC("unnamedbuffer");
    SQInteger size;
    sq_getstring(v,2,&src);
    size=sq_getsize(v,2);
    if(nargs>2){
        sq_getstring(v,3,&name);
    }
    if(SQ_SUCCEEDED(sq_compilebuffer(v,src,size,name,SQFalse)))
        return 1;
    else
        return SQ_ERROR;
}